

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

void __thiscall NJamSpell::TSpellCorrector::Inserts(TSpellCorrector *this,wstring *w,TWords *result)

{
  bool bVar1;
  long lVar2;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *this_00;
  TWord TVar3;
  undefined1 local_e8 [8];
  TWord c;
  wstring local_a8 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_88 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68 [8];
  wstring s;
  value_type_conflict *ch;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *__range2;
  size_t i;
  TWords *result_local;
  wstring *w_local;
  TSpellCorrector *this_local;
  
  __range2 = (unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
              *)0x0;
  while( true ) {
    lVar2 = std::__cxx11::wstring::size();
    if ((unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
         *)(lVar2 + 1U) <= __range2) break;
    this_00 = TLangModel::GetAlphabet(&this->LangModel);
    __end2 = std::
             unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
             ::begin(this_00);
    ch = (value_type_conflict *)
         std::
         unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
         ::end(this_00);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end2.super__Node_iterator_base<wchar_t,_false>,
                         (_Node_iterator_base<wchar_t,_false> *)&ch);
      if (!bVar1) break;
      std::__detail::_Node_const_iterator<wchar_t,_true,_false>::operator*(&__end2);
      std::__cxx11::wstring::substr((ulong)local_a8,(ulong)w);
      std::operator+(local_88,(wchar_t)local_a8);
      std::__cxx11::wstring::substr((ulong)&c.Len,(ulong)w);
      std::operator+(local_68,local_88);
      std::__cxx11::wstring::~wstring((wstring *)&c.Len);
      std::__cxx11::wstring::~wstring((wstring *)local_88);
      std::__cxx11::wstring::~wstring(local_a8);
      TVar3 = TLangModel::GetWord(&this->LangModel,local_68);
      c.Ptr = (wchar_t *)TVar3.Len;
      local_e8 = (undefined1  [8])TVar3.Ptr;
      if ((local_e8 != (undefined1  [8])0x0) && (c.Ptr != (wchar_t *)0x0)) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (result,(value_type *)local_e8);
        TVar3.Len = (size_t)c.Ptr;
        TVar3.Ptr = (wchar_t *)local_e8;
      }
      c.Ptr = (wchar_t *)TVar3.Len;
      local_e8 = (undefined1  [8])TVar3.Ptr;
      std::__cxx11::wstring::~wstring((wstring *)local_68);
      std::__detail::_Node_const_iterator<wchar_t,_true,_false>::operator++(&__end2);
    }
    __range2 = (unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                *)((long)&(__range2->_M_h)._M_buckets + 1);
  }
  return;
}

Assistant:

void TSpellCorrector::Inserts(const std::wstring& w, TWords& result) const {
    for (size_t i = 0; i < w.size() + 1; ++i) {
        for (auto&& ch: LangModel.GetAlphabet()) {
            std::wstring s = w.substr(0, i) + ch + w.substr(i);
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
        }
    }
}